

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::findKBest
          (Model *this,int32_t k,real threshold,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden,Vector *output)

{
  element_type *peVar1;
  real *prVar2;
  size_type sVar3;
  reference pvVar4;
  iterator iVar5;
  iterator __last;
  Model *in_RDX;
  int in_ESI;
  Vector *in_RDI;
  float in_XMM0_Da;
  real rVar6;
  int32_t i;
  undefined4 in_stack_ffffffffffffff88;
  real in_stack_ffffffffffffff8c;
  Model *in_stack_ffffffffffffff90;
  Vector *in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb0;
  Vector *in_stack_ffffffffffffffb8;
  Model *in_stack_ffffffffffffffc0;
  int local_2c;
  
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x191f45);
  if (peVar1->loss == ova) {
    computeOutputSigmoid
              ((Model *)in_stack_ffffffffffffffb0._M_current,in_stack_ffffffffffffffa8,in_RDI);
  }
  else {
    computeOutputSoftmax
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (Vector *)in_stack_ffffffffffffffb0._M_current);
  }
  local_2c = 0;
  do {
    if (*(int *)((long)&in_RDI[7].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + 4) <= local_2c) {
      return;
    }
    prVar2 = Vector::operator[]((Vector *)in_stack_ffffffffffffff90,
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (in_XMM0_Da <= *prVar2) {
      sVar3 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         in_RDX);
      if (sVar3 == (long)in_ESI) {
        Vector::operator[]((Vector *)in_stack_ffffffffffffff90,
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        rVar6 = std_log(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        pvVar4 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::front
                           ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                             *)in_stack_ffffffffffffff90);
        if (rVar6 < pvVar4->first) goto LAB_001920e7;
      }
      in_stack_ffffffffffffff90 = in_RDX;
      Vector::operator[]((Vector *)in_RDX,
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      std_log(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      std::make_pair<float,int&>
                ((float *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (int *)0x19204b);
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::push_back
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 in_stack_ffffffffffffff90,
                 (value_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      iVar5 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      __last = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                         ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      std::
      push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  )iVar5._M_current,
                 (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  )__last._M_current,
                 (_func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *)
                 in_stack_ffffffffffffffb0._M_current);
      sVar3 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         in_RDX);
      if ((ulong)(long)in_ESI < sVar3) {
        in_stack_ffffffffffffffb0 =
             std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                       ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        iVar5 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                          ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *
                           )CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        std::
        pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                  ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                    )in_stack_ffffffffffffffb0._M_current,
                   (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                    )iVar5._M_current,(_func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *)in_RDI
                  );
        std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::pop_back
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   0x1920e5);
      }
    }
LAB_001920e7:
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void Model::findKBest(
		int32_t k,
		real threshold,
		std::vector<std::pair<real, int32_t>>& heap,
		Vector& hidden,
		Vector& output) const {
	if (args_->loss == loss_name::ova) {
		computeOutputSigmoid(hidden, output);
	} else {
		computeOutputSoftmax(hidden, output);
	}
	for (int32_t i = 0; i < osz_; i++) {
		if (output[i] < threshold) {
			continue;
		}
		if (heap.size() == k && std_log(output[i]) < heap.front().first) {
			continue;
		}
		heap.push_back(std::make_pair(std_log(output[i]), i));
		std::push_heap(heap.begin(), heap.end(), comparePairs);
		if (heap.size() > k) {
			std::pop_heap(heap.begin(), heap.end(), comparePairs);
			heap.pop_back();
		}
	}
}